

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void RigidBodyDynamics::CalcAssemblyQDot
               (Model *model,VectorNd *Q,VectorNd *QDotInit,ConstraintSet *cs,VectorNd *QDot,
               VectorNd *weights)

{
  double dVar1;
  ulong uVar2;
  undefined8 uVar3;
  Index IVar4;
  Index IVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  size_t blockRows;
  long in_RDI;
  LinearSolver in_stack_0000007c;
  VectorNd *in_stack_00000080;
  VectorNd *in_stack_00000088;
  MatrixNd *in_stack_00000090;
  uint i;
  VectorNd x;
  VectorNd b;
  MatrixNd A;
  MatrixNd constraintJac;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 uVar8;
  MatrixNd *in_stack_fffffffffffffcc8;
  ConstraintSet *in_stack_fffffffffffffcd0;
  VectorNd *in_stack_fffffffffffffcd8;
  Model *in_stack_fffffffffffffce0;
  allocator<char> *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  uint local_194;
  
  uVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (uVar2 != *(uint *)(in_RDI + 0x48)) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
              );
    Errors::RBDLDofMismatchError::RBDLDofMismatchError
              ((RBDLDofMismatchError *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    __cxa_throw(uVar3,&Errors::RBDLDofMismatchError::typeinfo,
                Errors::RBDLDofMismatchError::~RBDLDofMismatchError);
  }
  uVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (uVar2 != *(uint *)(in_RDI + 0x4c)) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
              );
    Errors::RBDLDofMismatchError::RBDLDofMismatchError
              ((RBDLDofMismatchError *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    __cxa_throw(uVar3,&Errors::RBDLDofMismatchError::typeinfo,
                Errors::RBDLDofMismatchError::~RBDLDofMismatchError);
  }
  IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (IVar4 != IVar5) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
              );
    Errors::RBDLDofMismatchError::RBDLDofMismatchError
              ((RBDLDofMismatchError *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    __cxa_throw(uVar3,&Errors::RBDLDofMismatchError::typeinfo,
                Errors::RBDLDofMismatchError::~RBDLDofMismatchError);
  }
  IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  IVar5 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (IVar4 != IVar5) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0
              );
    Errors::RBDLDofMismatchError::RBDLDofMismatchError
              ((RBDLDofMismatchError *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    __cxa_throw(uVar3,&Errors::RBDLDofMismatchError::typeinfo,
                Errors::RBDLDofMismatchError::~RBDLDofMismatchError);
  }
  ConstraintSet::size((ConstraintSet *)0x6e16da);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffffcc8,
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffcb8);
  ConstraintSet::size((ConstraintSet *)0x6e1721);
  ConstraintSet::size((ConstraintSet *)0x6e1756);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffffcc8,
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffcb8);
  ConstraintSet::size((ConstraintSet *)0x6e17b1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffcc8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),in_stack_fffffffffffffcb8
            );
  ConstraintSet::size((ConstraintSet *)0x6e1804);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffcc8);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),in_stack_fffffffffffffcb8
            );
  local_194 = 0;
  while( true ) {
    IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                       CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    if (IVar4 <= (long)(ulong)local_194) break;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                        (Index)in_stack_fffffffffffffcb8);
    dVar1 = *pdVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                        (Index)in_stack_fffffffffffffcb8,0x6e18c4);
    *pSVar7 = dVar1;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                        (Index)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffd00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pdVar6;
    pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                        (Index)in_stack_fffffffffffffcb8);
    in_stack_fffffffffffffcf0 = (allocator<char> *)((double)in_stack_fffffffffffffd00 * *pdVar6);
    in_stack_fffffffffffffcf8 =
         (string *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                   ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                    CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                    (Index)in_stack_fffffffffffffcb8);
    *(allocator<char> **)in_stack_fffffffffffffcf8 = in_stack_fffffffffffffcf0;
    local_194 = local_194 + 1;
  }
  CalcConstraintsJacobian
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
             in_stack_fffffffffffffcc8,SUB41((uint)in_stack_fffffffffffffcc4 >> 0x18,0));
  uVar2 = (ulong)*(uint *)(in_RDI + 0x48);
  blockRows = ConstraintSet::size((ConstraintSet *)0x6e1a39);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_long,unsigned_int>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8,(Index)in_stack_fffffffffffffcf0,blockRows,
             (uint)(uVar2 >> 0x20));
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcb8);
  uVar8 = *(undefined4 *)(in_RDI + 0x48);
  ConstraintSet::size((ConstraintSet *)0x6e1aca);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_int,unsigned_long>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8,(Index)in_stack_fffffffffffffcf0,
             (uint)(blockRows >> 0x20),uVar2);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             CONCAT44(uVar8,in_stack_fffffffffffffcc0),
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             in_stack_fffffffffffffcb8);
  SolveLinearSystem(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_0000007c);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<unsigned_int,int>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8,(Index)in_stack_fffffffffffffcf0,
             (uint)(blockRows >> 0x20),(int)blockRows);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)CONCAT44(uVar8,in_stack_fffffffffffffcc0),
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
             in_stack_fffffffffffffcb8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6e1b8f);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6e1b9c);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x6e1ba9);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x6e1bb6);
  return;
}

Assistant:

RBDL_DLLAPI
void CalcAssemblyQDot (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDotInit,
  ConstraintSet &cs,
  Math::VectorNd &QDot,
  const Math::VectorNd &weights
)
{
  if(QDot.size() != model.dof_count) {
    throw Errors::RBDLDofMismatchError("Incorrect QDot vector size.\n");
  }
  if(Q.size() != model.q_size) {
    throw Errors::RBDLDofMismatchError("Incorrect Q vector size.\n");
  }
  if(QDotInit.size() != QDot.size()) {
    throw Errors::RBDLDofMismatchError("Incorrect QDotInit vector size.\n");
  }
  if(weights.size() != QDot.size()) {
    throw Errors::RBDLDofMismatchError("Incorrect weight vector size.\n");
  }

  // Initialize variables.
  MatrixNd constraintJac = MatrixNd::Zero(cs.size(), model.dof_count);
  MatrixNd A = MatrixNd::Zero(cs.size() + model.dof_count, cs.size()
                              + model.dof_count);
  VectorNd b = VectorNd::Zero(cs.size() + model.dof_count);
  VectorNd x = VectorNd::Zero(cs.size() + model.dof_count);

  // The top-left block is the weight matrix and is constant.
  for(unsigned int i = 0; i < weights.size(); ++i) {
    A(i,i) = weights[i];
    b[i] = weights[i] * QDotInit[i];
  }
  CalcConstraintsJacobian (model, Q, cs, constraintJac);
  A.block (model.dof_count, 0, cs.size(), model.dof_count) = constraintJac;
  A.block (0, model.dof_count, model.dof_count, cs.size())
    = constraintJac.transpose();

  // Solve the sistem A*x = b.
  SolveLinearSystem (A, b, x, cs.linear_solver);

  // Copy the result to the output variable.
  QDot = x.block (0, 0, model.dof_count, 1);
}